

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O2

int Wln_ObjAlloc(Wln_Ntk_t *p,int Type,int Signed,int End,int Beg)

{
  Vec_Int_t *p_00;
  int i;
  Hash_IntMan_t *p_01;
  Vec_Int_t *p_02;
  ulong uVar1;
  Wln_Vec_t *pWVar2;
  char *pcVar3;
  Hash_IntObj_t *pHVar4;
  int *piVar5;
  ulong uVar6;
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint nCapMin;
  int iVar11;
  
  p_00 = &p->vTypes;
  i = (p->vTypes).nSize;
  lVar9 = (long)i;
  if (i == (p->vTypes).nCap) {
    if (p->vFanins == (Wln_Vec_t *)0x0) {
      pWVar2 = (Wln_Vec_t *)malloc(lVar9 << 5);
    }
    else {
      pWVar2 = (Wln_Vec_t *)realloc(p->vFanins,lVar9 << 5);
    }
    p->vFanins = pWVar2;
    memset(pWVar2 + lVar9,0,lVar9 * 0x10);
    Vec_IntGrow(p_00,i * 2);
  }
  if (i == (p->vSigns).nSize) {
    if (i == (p->vRanges).nSize) {
      Vec_IntPush(p_00,Type);
      iVar11 = (p->vSigns).nSize;
      if (iVar11 == (p->vSigns).nCap) {
        uVar10 = 0x10;
        if (0xf < iVar11) {
          uVar10 = iVar11 * 2;
        }
        if (iVar11 < (int)uVar10) {
          pcVar3 = (p->vSigns).pArray;
          if (pcVar3 == (char *)0x0) {
            pcVar3 = (char *)malloc((ulong)uVar10);
          }
          else {
            pcVar3 = (char *)realloc(pcVar3,(ulong)uVar10);
            iVar11 = (p->vSigns).nSize;
          }
          (p->vSigns).pArray = pcVar3;
          (p->vSigns).nCap = uVar10;
        }
      }
      (p->vSigns).nSize = iVar11 + 1;
      (p->vSigns).pArray[iVar11] = (char)Signed;
      p_01 = p->pRanges;
      p_02 = p_01->vTable;
      iVar8 = p_01->vObjs->nSize / 4;
      iVar11 = p_02->nSize;
      if (iVar11 < iVar8) {
        uVar10 = iVar11 * 2;
        uVar6 = (ulong)(iVar11 * 2 - 1);
        do {
          nCapMin = (int)uVar6 + 1;
          if ((uVar6 & 1) == 0) {
            uVar6 = 3;
            do {
              iVar11 = (int)uVar6;
              if (nCapMin < (uint)(iVar11 * iVar11)) {
                Vec_IntGrow(p_02,nCapMin);
                for (uVar6 = 0; uVar10 != uVar6; uVar6 = uVar6 + 1) {
                  p_02->pArray[uVar6] = 0;
                }
                p_02->nSize = nCapMin;
                for (iVar11 = 1; iVar11 < iVar8; iVar11 = iVar11 + 1) {
                  pHVar4 = Hash_IntObj(p_01,iVar11);
                  pHVar4->iNext = 0;
                  piVar5 = Hash_Int2ManLookup(p_01,pHVar4->iData0,pHVar4->iData1);
                  if (*piVar5 != 0) {
                    __assert_fail("*pPlace == 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHash.h"
                                  ,0xac,"int Hash_Int2ManInsert(Hash_IntMan_t *, int, int, int)");
                  }
                  *piVar5 = iVar11;
                }
                goto LAB_00300703;
              }
              uVar1 = (ulong)nCapMin % uVar6;
              uVar6 = (ulong)(iVar11 + 2);
            } while ((int)uVar1 != 0);
          }
          uVar10 = uVar10 + 1;
          uVar6 = (ulong)nCapMin;
        } while( true );
      }
LAB_00300703:
      piVar5 = Hash_Int2ManLookup(p_01,End,Beg);
      iVar11 = *piVar5;
      if (*piVar5 == 0) {
        *piVar5 = iVar8;
        Vec_IntPush(p_01->vObjs,End);
        Vec_IntPush(p_01->vObjs,Beg);
        Vec_IntPush(p_01->vObjs,0);
        Vec_IntPush(p_01->vObjs,0);
        iVar11 = iVar8;
      }
      Vec_IntPush(&p->vRanges,iVar11);
      iVar11 = Vec_IntEntry(p_00,i);
      if (iVar11 == 3) {
        paVar7 = &p->vFanins[lVar9].field_2;
        if (2 < p->vFanins[lVar9].nSize) {
          paVar7 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar7->pArray[0];
        }
        paVar7->Array[1] = (p->vCis).nSize;
        Vec_IntPush(&p->vCis,i);
      }
      iVar11 = Vec_IntEntry(p_00,i);
      if (iVar11 == 4) {
        paVar7 = &p->vFanins[lVar9].field_2;
        if (2 < p->vFanins[lVar9].nSize) {
          paVar7 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar7->pArray[0];
        }
        paVar7->Array[1] = (p->vCos).nSize;
        Vec_IntPush(&p->vCos,i);
      }
      iVar11 = Vec_IntEntry(p_00,i);
      if (iVar11 == 0x59) {
        Vec_IntPush(&p->vFfs,i);
      }
      p->nObjs[Type] = p->nObjs[Type] + 1;
      return i;
    }
    pcVar3 = "iObj == Vec_IntSize(&p->vRanges)";
    uVar10 = 0x73;
  }
  else {
    pcVar3 = "iObj == Vec_StrSize(&p->vSigns)";
    uVar10 = 0x72;
  }
  __assert_fail(pcVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnObj.c"
                ,uVar10,"int Wln_ObjAlloc(Wln_Ntk_t *, int, int, int, int)");
}

Assistant:

int Wln_ObjAlloc( Wln_Ntk_t * p, int Type, int Signed, int End, int Beg )
{
    int iObj = Vec_IntSize(&p->vTypes);
    if ( iObj == Vec_IntCap(&p->vTypes) )
    {
        p->vFanins = ABC_REALLOC( Wln_Vec_t, p->vFanins, 2 * iObj );
        memset( p->vFanins + iObj, 0, sizeof(Wln_Vec_t) * iObj );
        Vec_IntGrow( &p->vTypes, 2 * iObj );
    }
    assert( iObj == Vec_StrSize(&p->vSigns) );
    assert( iObj == Vec_IntSize(&p->vRanges) );
    Vec_IntPush( &p->vTypes, Type );
    Vec_StrPush( &p->vSigns, (char)Signed );
    Vec_IntPush( &p->vRanges, Hash_Int2ManInsert(p->pRanges, End, Beg, 0) );
    if ( Wln_ObjIsCi(p, iObj) ) Wln_ObjSetFanin( p, iObj, 1, Vec_IntSize(&p->vCis) ), Vec_IntPush( &p->vCis, iObj );
    if ( Wln_ObjIsCo(p, iObj) ) Wln_ObjSetFanin( p, iObj, 1, Vec_IntSize(&p->vCos) ), Vec_IntPush( &p->vCos, iObj );
    if ( Wln_ObjIsFf(p, iObj) ) Vec_IntPush( &p->vFfs, iObj );
    p->nObjs[Type]++;
    return iObj;
}